

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O1

void __thiscall llvm::yaml::Document::parseYAMLDirective(Document *this)

{
  Token local_48;
  
  Scanner::getNext(&local_48,
                   (Scanner *)
                   (this->stream->scanner)._M_t.
                   super___uniq_ptr_impl<llvm::yaml::Scanner,_std::default_delete<llvm::yaml::Scanner>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_llvm::yaml::Scanner_*,_std::default_delete<llvm::yaml::Scanner>_>
                   .super__Head_base<0UL,_llvm::yaml::Scanner_*,_false>);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.Value._M_dataplus._M_p != &local_48.Value.field_2) {
    operator_delete(local_48.Value._M_dataplus._M_p,local_48.Value.field_2._M_allocated_capacity + 1
                   );
  }
  return;
}

Assistant:

void Document::parseYAMLDirective() {
  getNext(); // Eat %YAML <version>
}